

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,ON_SubDFace *center_face0)

{
  ushort uVar1;
  ON_SubDVertex *this_00;
  ON_SubDFace *pOVar2;
  uint uVar15;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ON_SubDEdge *pOVar9;
  ushort uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar16;
  uint uVar17;
  ON_SubDEdgePtr *pOVar18;
  
  if (center_face0 == (ON_SubDFace *)0x0) {
    Destroy(this);
    bVar3 = true;
  }
  else {
    uVar1 = center_face0->m_edge_count;
    if ((2 < uVar1) &&
       (pOVar9 = ON_SubDFace::Edge(center_face0,uVar1 - 1), pOVar9 != (ON_SubDEdge *)0x0)) {
      uVar13 = 4;
      if (4 < uVar1) {
        uVar13 = (uint)uVar1;
      }
      pOVar18 = center_face0->m_edge4;
      bVar3 = ON_SubDEdge::IsHardCrease(pOVar9);
      uVar8 = 0;
      bVar11 = 0;
      iVar7 = 0;
      uVar6 = 0;
      do {
        uVar17 = (uint)uVar1;
        if ((uVar8 == 4) && (pOVar18 = center_face0->m_edgex, pOVar18 == (ON_SubDEdgePtr *)0x0)) {
LAB_00611a33:
          if (uVar8 != uVar17) goto LAB_00611a9a;
          break;
        }
        uVar12 = pOVar18->m_ptr;
        pOVar9 = (ON_SubDEdge *)(uVar12 & 0xfffffffffffffff8);
        if (pOVar9 == (ON_SubDEdge *)0x0) goto LAB_00611a33;
        bVar4 = ON_SubDEdge::IsHardCrease(pOVar9);
        this_00 = pOVar9->m_vertex[(uint)uVar12 & 1];
        if (((this_00 == (ON_SubDVertex *)0x0) || (uVar5 = this_00->m_edge_count, uVar5 < 2)) ||
           (uVar10 = this_00->m_face_count, uVar5 < uVar10)) goto LAB_00611a33;
        uVar14 = (uint)uVar5;
        uVar16 = 4;
        if (4 < uVar5) {
          uVar16 = uVar14;
        }
        if ((bVar3 & bVar4) == 1) {
          bVar3 = ON_SubDVertex::IsCreaseOrCorner(this_00);
          if (!bVar3) {
            uVar5 = this_00->m_edge_count;
            uVar10 = this_00->m_face_count;
            goto LAB_00611995;
          }
        }
        else {
LAB_00611995:
          bVar11 = bVar11 | uVar5 == 2;
          if (uVar10 != 0) {
            uVar12 = 0;
            do {
              pOVar2 = this_00->m_faces[uVar12];
              if (pOVar2 != center_face0 && pOVar2 != (ON_SubDFace *)0x0) {
                uVar15._0_2_ = pOVar2->m_edge_count;
                uVar15._2_2_ = pOVar2->m_edgex_capacity;
                if ((ushort)(undefined2)uVar15 < 5) {
                  uVar15 = 4;
                }
                uVar13 = uVar13 + (uVar15 & 0xffff);
              }
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
        }
        uVar6 = uVar6 + uVar14;
        iVar7 = iVar7 + uVar16;
        uVar8 = uVar8 + 1;
        pOVar18 = pOVar18 + 1;
        bVar3 = bVar4;
      } while (uVar8 != uVar17);
      uVar8 = ON_SubDComponentBase::SubdivisionLevel(&center_face0->super_ON_SubDComponentBase);
      bVar3 = Internal_ReserveSubDWorkspace
                        (this,(ulong)((uVar6 - uVar17) * 2 + 1),(ulong)uVar6,
                         (ulong)((uVar6 - uVar17) * 8 + (iVar7 + uVar13) * 2),
                         (bool)(uVar8 == 0 | bVar11));
      return bVar3;
    }
LAB_00611a9a:
    Destroy(this);
    ON_SubDIncrementErrorCount();
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  const ON_SubDFace* center_face0
  )
{
  unsigned int v_capacity =  0;
  unsigned int f_capacity =  0;
  unsigned int a_capacity =  0;

  for (;;)
  {
    if (nullptr == center_face0)
      break;

    const unsigned int N = center_face0->m_edge_count;
    if (N <= 2)
      break;

    unsigned int S = 0;  // Set S = sum of the number of edges attached to each vertex of center_face0.
    unsigned int T = Internal_AtLeast4(N);  // Set T = capacity required for vertex edge arrays on face subdivision vertices
    unsigned int X = 0;
    bool bValenceTwoVertices = false; // bValenceTwoVertices = true if center_face0 has a valence 2 vertex and we need the hash table
    {
      const ON_SubDEdgePtr* edges = center_face0->m_edge4;
      ON__UINT_PTR edge_ptr;
      const ON_SubDEdge* edge;
      const ON_SubDVertex* vertex;
      const ON_SubDFace* vertex_face;
      unsigned int fei;
      edge = center_face0->Edge(N - 1);
      if (nullptr == edge)
        break;
      bool bEdgeIsHardCrease[2] = { false, edge->IsHardCrease() };
      for (fei = 0; fei < N; fei++, edges++)
      {
        if (4 == fei)
        {
          edges = center_face0->m_edgex;
          if (nullptr == edges)
            break;
        }
        edge_ptr = edges->m_ptr;
        edge = ON_SUBD_EDGE_POINTER(edge_ptr);
        if (nullptr == edge)
          break;
        bEdgeIsHardCrease[0] = bEdgeIsHardCrease[1];
        bEdgeIsHardCrease[1] = edge->IsHardCrease();
        vertex = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(edge_ptr)];
        if (nullptr == vertex)
          break;
        if (vertex->m_edge_count < 2)
          break;
        if (vertex->m_edge_count < vertex->m_face_count)
          break;
        S += vertex->m_edge_count;
        X += Internal_AtLeast4(vertex->m_edge_count);
        if ( bEdgeIsHardCrease[0] && bEdgeIsHardCrease[1] && vertex->IsCreaseOrCorner() )
        {
          // If this vertex has multiple sectors, the other sectors are isolated from center_face0 by hard creases.
          continue;
        }
        if (2 == vertex->m_edge_count)
        {
          // ring face has valence 2 vertex and the subdivision point for vertex_face
          // may be reference by 2 different edges from center_face0
          bValenceTwoVertices = true;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; ++vfi)
        {
          vertex_face = vertex->m_faces[vfi];
          if (nullptr == vertex_face || center_face0 == vertex_face)
            continue;
          T += Internal_AtLeast4(vertex_face->m_edge_count);
        }
      }
      if (fei != N)
        break;
    }

    // NOTE: S >= 2*N
    v_capacity =  2*(S - N) + 1; // maximum possible and occurs when all face0 edges are distinct and smooth
    f_capacity =  S;  // maximum possible and occurs when all face0 edges are distinct and smooth

    // T = capacity required for vertex edge arrays on face subdivision vertices
    // 4*(S-N) = capacity required for vertex edge arrays on edge subdivision vertices
    // X = capacity required for vertex edge arrays on vertex subdivision vertices
    //
    a_capacity = 2*( X + T + 4 * (S - N) ); // Twice the number of edges from all subdivision vertices.

    return Internal_ReserveSubDWorkspace(
      v_capacity,
      f_capacity,
      a_capacity,
      (0U == center_face0->SubdivisionLevel()) || bValenceTwoVertices
    );
  }

  Destroy();
  if (nullptr == center_face0 )
    return true;

  return ON_SUBD_RETURN_ERROR(false);
}